

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

uchar * stbi__load_and_postprocess_8bit(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  long *in_FS_OFFSET;
  int local_6c;
  int local_68;
  int local_64;
  stbi__context *psStack_48;
  int channels;
  void *result;
  stbi__result_info ri;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  ri.num_channels = req_comp;
  unique0x100000a6 = comp;
  psStack_48 = (stbi__context *)stbi__load_main(s,x,y,comp,req_comp,(stbi__result_info *)&result,8);
  if (psStack_48 == (stbi__context *)0x0) {
    s_local = (stbi__context *)0x0;
  }
  else {
    if ((int)result != 8 && (int)result != 0x10) {
      __assert_fail("ri.bits_per_channel == 8 || ri.bits_per_channel == 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/RuiwenTang[P]TinyRender/third_party/stb_image.h"
                    ,0x4a3,
                    "unsigned char *stbi__load_and_postprocess_8bit(stbi__context *, int *, int *, int *, int)"
                   );
    }
    if ((int)result != 8) {
      if (ri.num_channels == 0) {
        local_64 = *stack0xffffffffffffffd0;
      }
      else {
        local_64 = ri.num_channels;
      }
      psStack_48 = (stbi__context *)stbi__convert_16_to_8((stbi__uint16 *)psStack_48,*x,*y,local_64)
      ;
      result._0_4_ = 8;
    }
    if (*(int *)(*in_FS_OFFSET + -4) == 0) {
      local_68 = stbi__vertically_flip_on_load_global;
    }
    else {
      local_68 = *(int *)(*in_FS_OFFSET + -8);
    }
    if (local_68 != 0) {
      if (ri.num_channels == 0) {
        local_6c = *stack0xffffffffffffffd0;
      }
      else {
        local_6c = ri.num_channels;
      }
      stbi__vertical_flip(psStack_48,*x,*y,local_6c);
    }
    s_local = psStack_48;
  }
  return (uchar *)s_local;
}

Assistant:

static unsigned char *stbi__load_and_postprocess_8bit(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi__result_info ri;
   void *result = stbi__load_main(s, x, y, comp, req_comp, &ri, 8);

   if (result == NULL)
      return NULL;

   // it is the responsibility of the loaders to make sure we get either 8 or 16 bit.
   STBI_ASSERT(ri.bits_per_channel == 8 || ri.bits_per_channel == 16);

   if (ri.bits_per_channel != 8) {
      result = stbi__convert_16_to_8((stbi__uint16 *) result, *x, *y, req_comp == 0 ? *comp : req_comp);
      ri.bits_per_channel = 8;
   }

   // @TODO: move stbi__convert_format to here

   if (stbi__vertically_flip_on_load) {
      int channels = req_comp ? req_comp : *comp;
      stbi__vertical_flip(result, *x, *y, channels * sizeof(stbi_uc));
   }

   return (unsigned char *) result;
}